

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O3

QLayoutItem * __thiscall QFormLayout::itemAt(QFormLayout *this,int row,ItemRole role)

{
  long lVar1;
  undefined8 *puVar2;
  
  lVar1 = *(long *)&(this->super_QLayout).field_0x8;
  if ((uint)(*(ulong *)(lVar1 + 0xd0) >> 1) <= (uint)row) {
    return (QLayoutItem *)0x0;
  }
  if (role < SpanningRole) {
    puVar2 = *(undefined8 **)
              (*(long *)(lVar1 + 200) + (long)(int)((uint)(role != LabelRole) + row * 2) * 8);
    if (puVar2 == (undefined8 *)0x0) {
      return (QLayoutItem *)0x0;
    }
  }
  else {
    if (role != SpanningRole) {
      return (QLayoutItem *)0x0;
    }
    puVar2 = *(undefined8 **)(*(long *)(lVar1 + 200) + (long)(row * 2 + 1) * 8);
    if (puVar2 == (undefined8 *)0x0) {
      return (QLayoutItem *)0x0;
    }
    if (*(char *)(puVar2 + 1) == '\0') {
      return (QLayoutItem *)0x0;
    }
  }
  return (QLayoutItem *)*puVar2;
}

Assistant:

QLayoutItem *QFormLayout::itemAt(int row, ItemRole role) const
{
    Q_D(const QFormLayout);
    if (uint(row) >= uint(d->m_matrix.rowCount()))
        return nullptr;
    switch (role) {
    case SpanningRole:
        if (QFormLayoutItem *item = d->m_matrix(row, 1))
            if (item->fullRow)
                return item->item;
        break;
    case LabelRole:
    case FieldRole:
        if (QFormLayoutItem *item = d->m_matrix(row, (role == LabelRole) ? 0 : 1))
            return item->item;
        break;
    }
    return nullptr;
}